

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

IDiagObjectAddress * __thiscall
Js::LocalsWalker::FindPropertyAddress
          (LocalsWalker *this,PropertyId propId,bool enumerateGroups,bool *isConst)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *ppVVar3;
  undefined4 extraout_var_00;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  IDiagObjectAddress *unaff_R13;
  int iVar4;
  bool bVar5;
  undefined1 local_80 [8];
  ResolvedObject resolveObject;
  
  *isConst = false;
  resolveObject._56_8_ = isConst;
  if ((propId == 0x1cf) && (this->hasUserNotDefinedArguments == true)) {
    local_80._0_4_ = -1;
    resolveObject.name._4_1_ = 0;
    resolveObject.propId = 0;
    resolveObject._4_4_ = 0;
    resolveObject.scriptContext = (ScriptContext *)0x0;
    resolveObject.address = (IDiagObjectAddress *)0x0;
    resolveObject.objectDisplay = (IDiagObjectModelDisplay *)0x0;
    resolveObject.obj = (Var)0x0;
    resolveObject.originalObj = (Var)0x0;
    resolveObject.propId = (*this->pFrame->_vptr_DiagStackFrame[10])();
    resolveObject._4_4_ = extraout_var;
    CreateArgumentsObject(this,(ResolvedObject *)local_80);
  }
  else {
    if (this->pVarWalkers !=
        (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      this_00 = this->pVarWalkers;
      iVar4 = (this_00->
              super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .count;
      bVar1 = 0 < iVar4;
      if (0 < iVar4) {
        iVar4 = 0;
        do {
          ppVVar3 = JsUtil::
                    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this_00,iVar4);
          if ((enumerateGroups) ||
             (bVar5 = false, ((*ppVVar3)->groupType & ~UIGroupType_Param) == UIGroupType_None)) {
            ppVVar3 = JsUtil::
                      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(this->pVarWalkers,iVar4);
            iVar2 = (*((*ppVVar3)->super_IDiagObjectModelWalkerBase).
                      _vptr_IDiagObjectModelWalkerBase[3])
                              (*ppVVar3,(ulong)(uint)propId,resolveObject._56_8_);
            bVar5 = (IDiagObjectAddress *)CONCAT44(extraout_var_00,iVar2) !=
                    (IDiagObjectAddress *)0x0;
            if (bVar5) {
              unaff_R13 = (IDiagObjectAddress *)CONCAT44(extraout_var_00,iVar2);
            }
          }
          if (bVar5) break;
          iVar4 = iVar4 + 1;
          this_00 = this->pVarWalkers;
          iVar2 = (this_00->
                  super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
          bVar1 = iVar4 < iVar2;
        } while (iVar4 < iVar2);
      }
      if (bVar1) {
        return unaff_R13;
      }
    }
    resolveObject.scriptContext = (ScriptContext *)0x0;
  }
  return (IDiagObjectAddress *)resolveObject.scriptContext;
}

Assistant:

IDiagObjectAddress * LocalsWalker::FindPropertyAddress(PropertyId propId, bool enumerateGroups, bool& isConst)
    {
        isConst = false;
        if (propId == PropertyIds::arguments && hasUserNotDefinedArguments)
        {
            ResolvedObject resolveObject;
            resolveObject.scriptContext = pFrame->GetScriptContext();
            if (CreateArgumentsObject(&resolveObject))
            {
                return resolveObject.address;
            }
        }

        if (pVarWalkers)
        {
            for (int i = 0; i < pVarWalkers->Count(); i++)
            {
                VariableWalkerBase *pVarWalker = pVarWalkers->Item(i);
                if (!enumerateGroups && !pVarWalker->IsWalkerForCurrentFrame())
                {
                    continue;
                }

                IDiagObjectAddress *address = pVarWalkers->Item(i)->FindPropertyAddress(propId, isConst);
                if (address != nullptr)
                {
                    return address;
                }
            }
        }

        return nullptr;
    }